

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFileBase.cpp
# Opt level: O3

char * fix_to_utf8(char *s,char **arena,char *arena_end)

{
  byte *pbVar1;
  void *pvVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pvVar2 = utf8valid(s);
  if (pvVar2 != (void *)0x0) {
    pbVar1 = (byte *)*arena;
    bVar3 = *s;
    pbVar4 = pbVar1;
    if (bVar3 != 0) {
      pbVar5 = (byte *)(s + 1);
      do {
        if ((char)bVar3 < '\0') {
          if (arena_end <= pbVar4 + 2) goto LAB_00124cc4;
          *pbVar4 = bVar3 >> 6 | 0xc0;
          pbVar4[1] = bVar3 & 0xbf;
          pbVar4 = pbVar4 + 2;
        }
        else {
          if (arena_end <= pbVar4 + 1) goto LAB_00124cc4;
          *pbVar4 = bVar3;
          pbVar4 = pbVar4 + 1;
        }
        bVar3 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar3 != 0);
    }
    if (pbVar4 + 1 < arena_end) {
      *pbVar4 = 0;
      pbVar4 = pbVar4 + 1;
    }
LAB_00124cc4:
    *arena = (char *)pbVar4;
    s = (char *)pbVar1;
  }
  return s;
}

Assistant:

char *fix_to_utf8(char *s, char **arena, char *arena_end) {
	if (!utf8valid(s)) {
		return s;
	}
	char *p     = *arena;
	char *begin = p;
	while (*s) {
		uint32_t c = (uint8_t)*s;
		if (c < 0x80) {
			if (p + 1 >= arena_end) goto done;
			*p++ = c;
		} else {
			if (p + 2 >= arena_end) goto done;
			*p++ = 0xc0 | (c >> 6);
			*p++ = 0x80 | (c & 0x3f);
		}
		++s;
	}
	if (p + 1 >= arena_end) goto done;
	*p++ = 0;
done:
	*arena = p;
	return begin;
}